

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleUsage.cpp
# Opt level: O2

void readmeExample1(void)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  GeneratorHole local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Generator<Iterable,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SaadAttieh[P]lazyCode_include_lazyCode_basicGenerators_h:88:22)>
  local_68;
  Collector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SaadAttieh[P]lazyCode_include_lazyCode_basicCollectors_h:231:13)>
  local_40;
  Collector<std::basic_ostream<char,_std::char_traits<char>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SaadAttieh[P]lazyCode_include_lazyCode_basicCollectors_h:202:19)>
  local_20;
  
  local_20.member = (basic_ostream<char,_std::char_traits<char>_> *)&std::cin;
  local_68.member.container =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_68.member.first._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_68.member.last._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  LazyCode::
  append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_LazyCode::GeneratorHole,_0>
            (&local_40,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68,&local_89);
  LazyCode::
  Collector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SaadAttieh[P]lazyCode/include/lazyCode/basicCollectors.h:231:13)>
  ::
  apply<LazyCode::Generator<std::basic_istream<char,_std::char_traits<char>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SaadAttieh[P]lazyCode_include_lazyCode_basicGenerators_h:322:22)>_>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_88,&local_40,
             (Generator<std::basic_istream<char,_std::char_traits<char>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SaadAttieh[P]lazyCode_include_lazyCode_basicGenerators_h:322:22)>
              *)&local_20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40.member);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_88._M_dataplus._M_p,local_88._M_string_length);
  local_68.member.first._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_88._M_dataplus._M_p;
  local_68.member.last._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_88._M_string_length;
  local_20.member = (basic_ostream<char,_std::char_traits<char>_> *)&std::cout;
  local_20.collector.first = true;
  local_20.collector.i = "\n";
  local_68.member.container =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&local_88;
  LazyCode::
  Collector<std::basic_ostream<char,_std::char_traits<char>_>_&,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SaadAttieh[P]lazyCode/include/lazyCode/basicCollectors.h:202:19)>
  ::
  apply<LazyCode::Generator<Iterable,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SaadAttieh[P]lazyCode_include_lazyCode_basicGenerators_h:88:22)>_>
            (&local_20,&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88);
  return;
}

Assistant:

void readmeExample1() {
    auto lines = lz::readLines(cin) | lz::append(vector<string>());
    std::sort(lines.begin(), lines.end());
    lz::generator(lines) | lz::write(cout, "\n");
}